

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

void nn_term(void)

{
  int s;
  
  if (self.inited != 0) {
    nn_mutex_lock(&self.lock);
    self.flags = self.flags | 2;
    nn_mutex_unlock(&self.lock);
    s = 0;
    do {
      nn_close(s);
      s = s + 1;
    } while (s != 0x200);
    nn_mutex_lock(&self.lock);
    self.flags = (self.flags & 0xfffffffcU) + 1;
    nn_condvar_broadcast(&self.cond);
    nn_mutex_unlock(&self.lock);
    return;
  }
  return;
}

Assistant:

void nn_term (void)
{
    int i;

    if (!self.inited) {
        return;
    }

    nn_mutex_lock (&self.lock);
    self.flags |= NN_CTX_FLAG_TERMING;
    nn_mutex_unlock (&self.lock);

    /* Make sure we really close resources, this will cause global
       resources to be freed too when the last socket is closed. */
    for (i = 0; i < NN_MAX_SOCKETS; i++) {
        (void) nn_close (i);
    }

    nn_mutex_lock (&self.lock);
    self.flags |= NN_CTX_FLAG_TERMED;
    self.flags &= ~NN_CTX_FLAG_TERMING;
    nn_condvar_broadcast(&self.cond);
    nn_mutex_unlock (&self.lock);
}